

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

env * __thiscall lest::env::context_abi_cxx11_(env *this)

{
  long in_RSI;
  undefined1 local_38 [40];
  env *this_local;
  
  this_local = this;
  sections_abi_cxx11_((env *)local_38);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (in_RSI + 0x20));
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

text context() { return testing + sections(); }